

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O0

void __thiscall serial::SerialException::~SerialException(SerialException *this)

{
  SerialException *this_local;
  
  ~SerialException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~SerialException() throw() {}